

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O1

void __thiscall
TPZBlockDiagonal<std::complex<double>_>::TPZBlockDiagonal
          (TPZBlockDiagonal<std::complex<double>_> *this,TPZVec<int> *blocksize)

{
  long local_28;
  
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow = 0;
  *(undefined8 *)
   ((long)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow + 2) = 0;
  *(undefined8 *)
   ((long)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol + 2) = 0;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZBlockDiagonal_01858160;
  (this->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01840c80;
  (this->fStorage).fStore = (complex<double> *)0x0;
  (this->fStorage).fNElements = 0;
  (this->fStorage).fNAlloc = 0;
  local_28 = 0;
  TPZVec<long>::TPZVec(&this->fBlockPos,1,&local_28);
  (this->fBlockSize)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  (this->fBlockSize).fStore = (int *)0x0;
  (this->fBlockSize).fNElements = 0;
  (this->fBlockSize).fNAlloc = 0;
  Initialize(this,blocksize);
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal(const TPZVec<int> &blocksize)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>(), fStorage(), fBlockPos(1,0),fBlockSize()
{
	Initialize(blocksize);
}